

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall
ObjectTest_basic_set_unordered_multiset_Test::ObjectTest_basic_set_unordered_multiset_Test
          (ObjectTest_basic_set_unordered_multiset_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004a1e18;
  return;
}

Assistant:

TEST(ObjectTest, basic_set_unordered_multiset) {
	object obj;

	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<bool>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<signed char>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<unsigned char>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<short>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<int>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<long>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<long long>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<intmax_t>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<float>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<double>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<long double>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_multiset<std::u8string>);
	OBJECT_BASIC_SET_TEST(obj, std::unordered_set<object>);
}